

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::SPxMainSM<double>::multiaggregation
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  Item *pIVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  Item *pIVar6;
  Nonzero<double> *pNVar7;
  pointer pdVar8;
  Nonzero<double> *pNVar9;
  int *piVar10;
  SPxOut *pSVar11;
  bool bVar12;
  bool bVar13;
  double dVar14;
  char cVar15;
  double dVar16;
  VectorBase<double> *pVVar17;
  VectorBase<double> *pVVar18;
  MultiAggregationPS *this_00;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  Item *pIVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long in_FS_OFFSET;
  undefined4 uVar30;
  undefined4 uVar31;
  double minVal;
  double minRes;
  double maxVal;
  VectorBase<double> upLocks;
  double maxRes;
  VectorBase<double> downLocks;
  double local_150;
  double local_130;
  int local_124;
  int local_120;
  int local_11c;
  SPxLPBase<double> *local_118;
  double local_110;
  double local_108;
  VectorBase<double> local_100;
  double local_e8;
  VectorBase<double> local_e0;
  double local_c8;
  value_type local_c0;
  VectorBase<double> local_b0;
  undefined1 local_98 [16];
  double local_88;
  int local_80;
  int local_7c;
  double local_78;
  undefined8 uStack_70;
  shared_ptr<soplex::Tolerances> local_68;
  ulong local_58;
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *local_50;
  bool *local_48;
  double local_40;
  ulong local_38;
  
  local_7c = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_80 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_48 = again;
  VectorBase<double>::VectorBase(&local_e0,local_80);
  VectorBase<double>::VectorBase
            (&local_b0,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  uVar20 = (ulong)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if ((long)uVar20 < 1) {
    local_124 = 0;
    iVar28 = 0;
    iVar26 = 0;
LAB_001f42b3:
    iVar23 = iVar26 + iVar28;
    if (iVar23 != 0 && SCARRY4(iVar26,iVar28) == iVar23 < 0) {
      piVar10 = &(this->super_SPxSimplifier<double>).m_remRows;
      *piVar10 = *piVar10 + iVar26;
      piVar10 = &(this->super_SPxSimplifier<double>).m_remCols;
      *piVar10 = *piVar10 + iVar28;
      piVar10 = &(this->super_SPxSimplifier<double>).m_remNzos;
      *piVar10 = *piVar10 + local_124;
      pSVar11 = (this->super_SPxSimplifier<double>).spxout;
      if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
        local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,pSVar11->m_verbosity);
        local_c0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)
                  CONCAT44(local_c0.
                           super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr._4_4_,4);
        (*pSVar11->_vptr_SPxOut[2])();
        pSVar11 = (this->super_SPxSimplifier<double>).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar11->m_streams[pSVar11->m_verbosity],
                   "Simplifier (multi-aggregation) removed ",0x27);
        std::ostream::operator<<((ostream *)pSVar11->m_streams[pSVar11->m_verbosity],iVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar11->m_streams[pSVar11->m_verbosity]," rows, ",7);
        std::ostream::operator<<((ostream *)pSVar11->m_streams[pSVar11->m_verbosity],iVar28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar11->m_streams[pSVar11->m_verbosity]," cols, ",7);
        std::ostream::operator<<((ostream *)pSVar11->m_streams[pSVar11->m_verbosity],local_124);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar11->m_streams[pSVar11->m_verbosity]," non-zeros",10);
        cVar15 = (char)pSVar11->m_streams[pSVar11->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar11->m_streams[pSVar11->m_verbosity] + -0x18) + cVar15)
        ;
        std::ostream::put(cVar15);
        std::ostream::flush();
        pSVar11 = (this->super_SPxSimplifier<double>).spxout;
        (*pSVar11->_vptr_SPxOut[2])(pSVar11,&local_100);
      }
      if ((double)(local_80 + local_7c) * (this->super_SPxSimplifier<double>).m_minReduction <
          (double)iVar23) {
        *local_48 = true;
      }
    }
    if (local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return OKAY;
  }
  local_78 = *(double *)(in_FS_OFFSET + -8);
  uStack_70 = 0;
  local_98._8_4_ = DAT_005f4010._8_4_;
  local_98._0_8_ = (ulong)DAT_005f4010 ^ (ulong)local_78;
  local_98._12_4_ = DAT_005f4010._12_4_;
  local_50 = &this->m_hist;
  iVar26 = 0;
  iVar28 = 0;
  local_124 = 0;
  local_118 = lp;
LAB_001f359b:
  uVar21 = uVar20 - 1;
  local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar20 - 1] = 0.0;
  local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar20 - 1] = 0.0;
  pIVar6 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar23 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar20 - 1].idx;
  local_38 = uVar20;
  if (1 < pIVar6[iVar23].data.super_SVectorBase<double>.memused) {
    pIVar6 = pIVar6 + iVar23;
    lVar29 = 8;
    lVar27 = 0;
    local_120 = iVar26;
    local_11c = iVar28;
    do {
      pNVar7 = (pIVar6->data).super_SVectorBase<double>.m_elem;
      dVar2 = *(double *)((long)pNVar7 + lVar29 + -8);
      dVar3 = (lp->super_LPRowSetBase<double>).left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[*(int *)((long)&pNVar7->val + lVar29)];
      ::soplex::infinity::__tls_init();
      iVar26 = *(int *)((long)&((pIVar6->data).super_SVectorBase<double>.m_elem)->val + lVar29);
      if (dVar3 <= (double)local_98._0_8_) {
        dVar3 = (lp->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar26];
        uVar30 = SUB84(dVar3,0);
        uVar31 = (undefined4)((ulong)dVar3 >> 0x20);
LAB_001f36d7:
        ::soplex::infinity::__tls_init();
        if ((double)local_98._0_8_ < (double)CONCAT44(uVar31,uVar30)) {
          pVVar18 = &local_b0;
          pVVar17 = &local_e0;
          if (dVar2 <= 0.0) {
joined_r0x001f3781:
            pVVar18 = pVVar17;
            if (0.0 <= dVar2) goto LAB_001f3798;
          }
          goto LAB_001f3783;
        }
        dVar3 = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[*(int *)((long)&((pIVar6->data).super_SVectorBase<double>.m_elem)->val +
                                 lVar29)];
        ::soplex::infinity::__tls_init();
        if (dVar3 < local_78) {
          pVVar18 = &local_e0;
          if (dVar2 <= 0.0) {
            pVVar17 = &local_b0;
            goto joined_r0x001f3781;
          }
          goto LAB_001f3783;
        }
      }
      else {
        dVar3 = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar26];
        ::soplex::infinity::__tls_init();
        if (local_78 <= dVar3) {
          dVar3 = (lp->super_LPRowSetBase<double>).left.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [*(int *)((long)&((pIVar6->data).super_SVectorBase<double>.m_elem)->val + lVar29)]
          ;
          uVar30 = SUB84(dVar3,0);
          uVar31 = (undefined4)((ulong)dVar3 >> 0x20);
          goto LAB_001f36d7;
        }
        local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar21] =
             local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar21] + 1.0;
        pVVar18 = &local_b0;
LAB_001f3783:
        pdVar8 = (pVVar18->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8[uVar21] = pdVar8[uVar21] + 1.0;
      }
LAB_001f3798:
      lVar27 = lVar27 + 1;
      iVar23 = (pIVar6->data).super_SVectorBase<double>.memused;
      lVar29 = lVar29 + 0x10;
    } while (lVar27 < iVar23);
    iVar26 = local_120;
    iVar28 = local_11c;
    if ((((local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar21] == 1.0) &&
         (!NAN(local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21]))) ||
        ((local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar21] == 1.0 &&
         (!NAN(local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar21]))))) && (0 < iVar23)) {
      local_c8 = (lp->super_LPColSetBase<double>).low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar21];
      local_110 = (lp->super_LPColSetBase<double>).up.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar21];
      lVar29 = 0;
      lVar27 = 0;
      do {
        pNVar7 = (pIVar6->data).super_SVectorBase<double>.m_elem;
        local_108 = *(double *)((long)&pNVar7->val + lVar29);
        iVar26 = *(int *)((long)&pNVar7->idx + lVar29);
        dVar2 = (lp->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar26];
        dVar3 = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar26];
        dVar14 = feastol(this);
        if (dVar14 < ABS(dVar2 - dVar3)) {
          ::soplex::infinity::__tls_init();
          ::soplex::infinity::__tls_init();
          iVar28 = (local_118->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
                   [(local_118->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                    [iVar26].idx].data.super_SVectorBase<double>.memused;
          uVar30 = 0xffc00000;
          uVar31 = 0x41dfffff;
          if (2 < iVar28) {
            uVar30 = 0;
            uVar31 = 0x40080000;
            if (iVar28 != 3) {
              uVar30 = (undefined4)*(undefined8 *)(&DAT_005f41c0 + (ulong)(iVar28 == 4) * 8);
              uVar31 = (undefined4)
                       ((ulong)*(undefined8 *)(&DAT_005f41c0 + (ulong)(iVar28 == 4) * 8) >> 0x20);
            }
          }
          if (dVar2 <= (double)local_98._0_8_) {
LAB_001f399a:
            bVar12 = false;
          }
          else {
            dVar14 = *(double *)
                      ((long)&((pIVar6->data).super_SVectorBase<double>.m_elem)->val + lVar29);
            if ((((dVar14 <= 0.0) ||
                 (0.0 < (local_118->super_LPColSetBase<double>).object.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar21])) ||
                (local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar21] != 1.0)) ||
               ((NAN(local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21]) ||
                (bVar12 = true,
                (double)CONCAT44(uVar31,uVar30) <
                local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar21])))) {
              if (((0.0 <= dVar14) ||
                  (((local_118->super_LPColSetBase<double>).object.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar21] < 0.0 ||
                   (local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar21] != 1.0)))) ||
                 (NAN(local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar21]))) goto LAB_001f399a;
              bVar12 = local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21] <= (double)CONCAT44(uVar31,uVar30);
            }
          }
          if (local_78 <= dVar3) {
LAB_001f3a63:
            bVar13 = false;
LAB_001f3a66:
            if (!(bool)(bVar12 | bVar13)) goto LAB_001f3caa;
          }
          else {
            dVar14 = *(double *)
                      ((long)&((pIVar6->data).super_SVectorBase<double>.m_elem)->val + lVar29);
            if ((((dVar14 <= 0.0) ||
                 ((local_118->super_LPColSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar21] < 0.0)) ||
                (local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar21] != 1.0)) ||
               ((NAN(local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21]) ||
                (bVar13 = true,
                (double)CONCAT44(uVar31,uVar30) <
                local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar21])))) {
              if (((0.0 <= dVar14) ||
                  ((0.0 < (local_118->super_LPColSetBase<double>).object.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar21] ||
                   (local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar21] != 1.0)))) ||
                 (NAN(local_b0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar21]))) goto LAB_001f3a63;
              bVar13 = local_e0.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21] <= (double)CONCAT44(uVar31,uVar30);
              goto LAB_001f3a66;
            }
          }
          local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c0.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          computeMinMaxResidualActivity
                    (this,local_118,iVar26,(int)uVar21,(double *)&local_100,(double *)&local_c0);
          if (bVar12) {
            computeMinMaxValues(this,local_118,dVar2,local_108,
                                (double)local_100.val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                (double)local_c0.
                                        super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,&local_130,&local_e8);
            dVar2 = local_130;
            ::soplex::infinity::__tls_init();
            dVar14 = local_130;
            if ((((dVar2 <= (double)local_98._0_8_) ||
                 (dVar2 = feastol(this), dVar16 = local_e8, dVar14 - local_c8 <= dVar2)) ||
                (::soplex::infinity::__tls_init(), dVar2 = local_e8, local_78 <= dVar16)) ||
               (dVar14 = feastol(this), -dVar14 <= dVar2 - local_110)) goto LAB_001f3baa;
            uVar24 = *(uint *)((long)&((pIVar6->data).super_SVectorBase<double>.m_elem)->idx +
                              lVar29);
            bVar12 = true;
            lp = local_118;
LAB_001f3d12:
            iVar26 = local_120;
            iVar28 = local_11c;
            if (-1 < (int)uVar24) {
              uVar20 = (ulong)uVar24;
              pVVar18 = &(lp->super_LPRowSetBase<double>).right;
              if (bVar12) {
                pVVar18 = &(lp->super_LPRowSetBase<double>).left;
              }
              pIVar1 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                       (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[uVar20].
                       idx;
              pNVar7 = (pIVar1->data).super_SVectorBase<double>.m_elem;
              local_150 = 0.0;
              if ((pNVar7 == (Nonzero<double> *)0x0) ||
                 (lVar27 = (long)(pIVar1->data).super_SVectorBase<double>.memused, lVar27 < 1))
              goto LAB_001f3d91;
              lVar29 = 0;
              goto LAB_001f3d72;
            }
            break;
          }
LAB_001f3baa:
          lp = local_118;
          if (bVar13) {
            computeMinMaxValues(this,local_118,dVar3,local_108,
                                (double)local_100.val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                (double)local_c0.
                                        super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,&local_130,&local_e8);
            dVar2 = local_130;
            ::soplex::infinity::__tls_init();
            dVar3 = local_130;
            if ((((double)local_98._0_8_ < dVar2) &&
                (dVar2 = feastol(this), dVar14 = local_e8, dVar2 < dVar3 - local_c8)) &&
               ((::soplex::infinity::__tls_init(), dVar2 = local_e8, dVar14 < local_78 &&
                (dVar3 = feastol(this), dVar2 - local_110 < -dVar3)))) {
              uVar24 = *(uint *)((long)&((pIVar6->data).super_SVectorBase<double>.m_elem)->idx +
                                lVar29);
              bVar12 = false;
              goto LAB_001f3d12;
            }
          }
        }
LAB_001f3caa:
        lVar27 = lVar27 + 1;
        lVar29 = lVar29 + 0x10;
        lp = local_118;
        iVar26 = local_120;
        iVar28 = local_11c;
      } while (lVar27 < (pIVar6->data).super_SVectorBase<double>.memused);
    }
  }
  goto LAB_001f3ce3;
  while (lVar29 = lVar29 + 0x10, lVar27 * 0x10 != lVar29) {
LAB_001f3d72:
    if (uVar21 == *(uint *)((long)&pNVar7->idx + lVar29)) {
      local_150 = *(double *)((long)&pNVar7->val + lVar29);
      break;
    }
  }
LAB_001f3d91:
  local_88 = (pVVar18->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20];
  this_00 = (MultiAggregationPS *)operator_new(0xa0);
  local_110 = (double)CONCAT44(local_110._4_4_,uVar24);
  local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_SPxSimplifier<double>)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->super_SPxSimplifier<double>)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  MultiAggregationPS::MultiAggregationPS(this_00,lp,this,uVar24,(int)uVar21,local_88,&local_68);
  local_c0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<double>::MultiAggregationPS*>
            (&local_c0.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  local_58 = uVar20;
  if (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::push_back(&local_50->data,&local_c0);
  iVar26 = (pIVar6->data).super_SVectorBase<double>.memused;
  if (0 < iVar26) {
    lVar27 = 0;
    uVar24 = local_110._0_4_;
    do {
      uVar4 = (pIVar6->data).super_SVectorBase<double>.m_elem[lVar27].idx;
      if (uVar4 != uVar24) {
        VectorBase<double>::VectorBase
                  (&local_100,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
        pdVar8 = local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar26 = (pIVar6->data).super_SVectorBase<double>.m_elem[lVar27].idx;
        local_108 = (lp->super_LPRowSetBase<double>).right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar26];
        pIVar22 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar26].idx;
        local_c8 = (lp->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar26];
        if (local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memset(local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,0,
                 (long)local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start & 0xfffffffffffffff8);
        }
        lVar29 = (long)(pIVar22->data).super_SVectorBase<double>.memused;
        if (0 < lVar29) {
          pNVar7 = (pIVar22->data).super_SVectorBase<double>.m_elem;
          lVar19 = 0;
          do {
            pdVar8[*(int *)((long)&pNVar7->idx + lVar19)] = *(double *)((long)&pNVar7->val + lVar19)
            ;
            lVar19 = lVar19 + 0x10;
          } while (lVar29 * 0x10 != lVar19);
        }
        uVar24 = local_110._0_4_;
        if (0 < (pIVar1->data).super_SVectorBase<double>.memused) {
          lVar29 = 0;
          do {
            pNVar7 = (pIVar1->data).super_SVectorBase<double>.m_elem;
            uVar5 = pNVar7[lVar29].idx;
            if (uVar21 != uVar5) {
              pIVar22 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
              iVar26 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                       [(int)uVar4].idx;
              pNVar9 = pIVar22[iVar26].data.super_SVectorBase<double>.m_elem;
              if ((pNVar9 != (Nonzero<double> *)0x0) &&
                 (lVar19 = (long)pIVar22[iVar26].data.super_SVectorBase<double>.memused, 0 < lVar19)
                 ) {
                lVar25 = 0;
                do {
                  if (*(uint *)((long)&pNVar9->idx + lVar25) == uVar5) {
                    local_130 = local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[(int)uVar5] -
                                (local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar21] *
                                pNVar7[lVar29].val) / local_150;
                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                              (lp,(ulong)uVar4,(ulong)uVar5,&local_130,0);
                    goto LAB_001f3fde;
                  }
                  lVar25 = lVar25 + 0x10;
                } while (lVar19 * 0x10 != lVar25);
              }
              local_130 = (-local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar21] * pNVar7[lVar29].val) /
                          local_150;
              (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                        (lp,(ulong)uVar4,(ulong)uVar5,&local_130,0);
            }
LAB_001f3fde:
            lVar29 = lVar29 + 1;
          } while (lVar29 < (pIVar1->data).super_SVectorBase<double>.memused);
        }
        local_40 = (lp->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar4];
        ::soplex::infinity::__tls_init();
        if (local_40 < local_78) {
          local_130 = local_108 -
                      (local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21] * local_88) / local_150;
          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
                    (lp,(ulong)uVar4,&local_130,0);
        }
        local_108 = (lp->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar4];
        ::soplex::infinity::__tls_init();
        if ((double)local_98._0_8_ < local_108) {
          local_130 = local_c8 -
                      (local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21] * local_88) / local_150;
          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
                    (lp,(ulong)uVar4,&local_130,0);
        }
        if (local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_100.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        iVar26 = (pIVar6->data).super_SVectorBase<double>.memused;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < iVar26);
  }
  iVar23 = local_11c;
  iVar28 = local_120;
  iVar26 = (pIVar1->data).super_SVectorBase<double>.memused;
  if (0 < iVar26) {
    lVar27 = 8;
    lVar29 = 0;
    do {
      pNVar7 = (pIVar1->data).super_SVectorBase<double>.m_elem;
      uVar24 = *(uint *)((long)&pNVar7->val + lVar27);
      if (uVar21 != uVar24) {
        pdVar8 = (lp->super_LPColSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        local_100.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pdVar8[(int)uVar24] -
                      (pdVar8[uVar21] * *(double *)((long)pNVar7 + lVar27 + -8)) / local_150);
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x27])
                  (lp,(long)(int)uVar24,&local_100,0);
        iVar26 = (pIVar1->data).super_SVectorBase<double>.memused;
      }
      lVar29 = lVar29 + 1;
      lVar27 = lVar27 + 0x10;
    } while (lVar29 < iVar26);
  }
  local_124 = local_124 +
              (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
              [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar21].idx].data
              .super_SVectorBase<double>.memused;
  piVar10 = (this->m_cIdx).data;
  piVar10[uVar21] =
       piVar10[(long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1];
  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x15])(lp);
  iVar26 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
           [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[local_58].idx].data.
           super_SVectorBase<double>.memused;
  piVar10 = (this->m_rIdx).data;
  piVar10[local_58] =
       piVar10[(long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1];
  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xf])
            (lp,(ulong)local_110 & 0xffffffff);
  piVar10 = (this->m_stat).data + 0x10;
  *piVar10 = *piVar10 + 1;
  if (local_c0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.
               super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_124 = local_124 + iVar26;
  iVar26 = iVar28 + 1;
  iVar28 = iVar23 + 1;
LAB_001f3ce3:
  uVar20 = uVar21;
  if ((long)local_38 < 2) goto LAB_001f42b3;
  goto LAB_001f359b;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::multiaggregation(SPxLPBase<R>& lp, bool& again)
{
   // this simplifier eliminates rows and columns by performing multi aggregations as identified by the constraint
   // activities.
   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   VectorBase<R> upLocks(lp.nCols());
   VectorBase<R> downLocks(lp.nCols());

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      // setting the locks on the variables
      upLocks[j] = 0;
      downLocks[j] = 0;

      if(lp.colVector(j).size() <= 1)
         continue;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(lp.lhs(col.index(k)) > R(-infinity) && lp.rhs(col.index(k)) < R(infinity))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(lp.lhs(col.index(k)) > R(-infinity))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(lp.rhs(col.index(k)) < R(infinity))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      // multi-aggregate column
      if(upLocks[j] == 1 || downLocks[j] == 1)
      {
         R lower = lp.lower(j);
         R upper = lp.upper(j);
         int maxOtherLocks;
         int bestpos = -1;
         bool bestislhs = true;

         for(int k = 0; k < col.size(); ++k)
         {
            int rowNumber;
            R lhs;
            R rhs;
            bool lhsExists;
            bool rhsExists;
            bool aggLhs;
            bool aggRhs;

            R val = col.value(k);

            rowNumber = col.index(k);
            lhs = lp.lhs(rowNumber);
            rhs = lp.rhs(rowNumber);

            if(EQ(lhs, rhs, feastol()))
               continue;

            lhsExists = lhs > R(-infinity);
            rhsExists = rhs < R(infinity);

            if(lp.rowVector(rowNumber).size() <= 2)
               maxOtherLocks = INT_MAX;
            else if(lp.rowVector(rowNumber).size() == 3)
               maxOtherLocks = 3;
            else if(lp.rowVector(rowNumber).size() == 4)
               maxOtherLocks = 2;
            else
               maxOtherLocks = 1;

            aggLhs = lhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks));
            aggRhs = rhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks));

            if(aggLhs || aggRhs)
            {
               R minRes = 0;   // this is the minimum value that the aggregation can attain
               R maxRes = 0;   // this is the maximum value that the aggregation can attain

               // computing the minimum and maximum residuals if variable j is set to zero.
               computeMinMaxResidualActivity(lp, rowNumber, j, minRes, maxRes);

               // we will try to aggregate to the lhs
               if(aggLhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, lhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  // if the bounds of the aggregation and the original variable are equivalent, then we can reduce
                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = true;
                     break;
                  }
               }

               // we will try to aggregate to the rhs
               if(aggRhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, rhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = false;
                     break;
                  }
               }
            }
         }

         // it is only possible to aggregate if a best position has been found
         if(bestpos >= 0)
         {
            const SVectorBase<R>& bestRow = lp.rowVector(bestpos);
            // aggregating the variable and applying the fixings to the all other constraints
            R aggConstant = (bestislhs ? lp.lhs(bestpos) : lp.rhs(
                                bestpos));   // this is the lhs or rhs of the aggregated row
            R aggAij =
               bestRow[j];                                   // this is the coefficient of the deleted col

            SPxOut::debug(this,
                          "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n",
                          j, bestpos, aggConstant, aggAij);

            std::shared_ptr<PostStep> ptr(new MultiAggregationPS(lp, *this, bestpos, j,
                                          aggConstant, this->_tolerances));
            m_hist.append(ptr);

            for(int k = 0; k < col.size(); ++k)
            {
               if(col.index(k) != bestpos)
               {
                  int rowNumber = col.index(k);
                  VectorBase<R> updateRow(lp.nCols());
                  R updateRhs = lp.rhs(col.index(k));
                  R updateLhs = lp.lhs(col.index(k));

                  updateRow = lp.rowVector(col.index(k));

                  // updating the row with the best row
                  for(int l = 0; l < bestRow.size(); l++)
                  {
                     if(bestRow.index(l) != j)
                     {
                        if(lp.rowVector(rowNumber).pos(bestRow.index(l)) >= 0)
                           lp.changeElement(rowNumber, bestRow.index(l), updateRow[bestRow.index(l)]
                                            - updateRow[j]*bestRow.value(l) / aggAij);
                        else
                           lp.changeElement(rowNumber, bestRow.index(l), -1.0 * updateRow[j]*bestRow.value(l) / aggAij);
                     }
                  }

                  // NOTE: I don't know whether we should change the LHS and RHS if they are currently at R(infinity)
                  if(lp.rhs(rowNumber) < R(infinity))
                     lp.changeRhs(rowNumber, updateRhs - updateRow[j]*aggConstant / aggAij);

                  if(lp.lhs(rowNumber) > R(-infinity))
                     lp.changeLhs(rowNumber, updateLhs - updateRow[j]*aggConstant / aggAij);

                  assert(LE(lp.lhs(rowNumber), lp.rhs(rowNumber), this->tolerances()->epsilon()));
               }
            }

            for(int l = 0; l < bestRow.size(); l++)
            {
               if(bestRow.index(l) != j)
                  lp.changeMaxObj(bestRow.index(l),
                                  lp.maxObj(bestRow.index(l)) - lp.maxObj(j)*bestRow.value(l) / aggAij);
            }

            ++remCols;
            remNzos += lp.colVector(j).size();
            removeCol(lp, j);
            ++remRows;
            remNzos += lp.rowVector(bestpos).size();
            removeRow(lp, bestpos);

            ++m_stat[MULTI_AGG];
         }
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (multi-aggregation) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}